

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_timesplit_array.h
# Opt level: O3

void __thiscall
embree::avx::
HeuristicMBlurTemporalSplit<embree::PrimRefMB,_embree::avx::SubdivRecalculatePrimRef,_2UL>::
TemporalBinInfo::bin
          (TemporalBinInfo *this,PrimRefMB *prims,size_t begin,size_t end,BBox1f time_range,
          SetMB *set,SubdivRecalculatePrimRef *recalculatePrimRef)

{
  float *pfVar1;
  float fVar2;
  BBox1f BVar3;
  BBox<embree::Vec3fa> *pBVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  ulong uVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  float fVar24;
  undefined1 in_register_00001208 [56];
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar48 [64];
  float fVar53;
  float fVar54;
  undefined1 auVar52 [16];
  float fVar55;
  float fVar58;
  float fVar59;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar60;
  
  auVar48._8_56_ = in_register_00001208;
  auVar48._0_8_ = time_range;
  auVar31 = vmovshdup_avx(auVar48._0_16_);
  fVar38 = auVar31._0_4_;
  fVar24 = time_range.lower;
  fVar2 = (set->super_PrimInfoMB).max_time_range.lower;
  fVar25 = (set->super_PrimInfoMB).max_time_range.upper - fVar2;
  fVar37 = (float)(set->super_PrimInfoMB).max_num_time_segments;
  fVar44 = (((fVar24 * 0.5 + fVar38 * 0.5) - fVar2) / fVar25) * fVar37;
  auVar33._8_4_ = 0x80000000;
  auVar33._0_8_ = 0x8000000080000000;
  auVar33._12_4_ = 0x80000000;
  auVar33 = vandps_avx(ZEXT416((uint)fVar44),auVar33);
  auVar30._8_4_ = 0x3effffff;
  auVar30._0_8_ = 0x3effffff3effffff;
  auVar30._12_4_ = 0x3effffff;
  auVar33 = vorps_avx(auVar33,auVar30);
  auVar33 = ZEXT416((uint)(fVar44 + auVar33._0_4_));
  auVar33 = vroundss_avx(auVar33,auVar33,0xb);
  fVar2 = (auVar33._0_4_ / fVar37) * fVar25 + fVar2;
  auVar33 = vcmpps_avx(auVar31,ZEXT416((uint)fVar2),6);
  auVar31 = vcmpps_avx(ZEXT416((uint)fVar2),auVar48._0_16_,6);
  auVar33 = vandps_avx(auVar31,auVar33);
  if (begin < end && (~auVar33[0] & 1) == 0) {
    auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar33 = ZEXT816(0) << 0x40;
    do {
      fVar44 = prims[begin].time_range.upper;
      fVar25 = fVar44 * 0.9999;
      if ((fVar24 < fVar25) && (fVar37 = prims[begin].time_range.lower, fVar37 * 1.0001 < fVar2)) {
        auVar39._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar39._4_8_ = SUB128(ZEXT812(0),4);
        auVar39._12_4_ = 0;
        fVar41 = (fVar24 - fVar37) / (fVar44 - fVar37);
        fVar37 = (fVar2 - fVar37) / (fVar44 - fVar37);
        fVar44 = fVar41 * auVar39._0_4_;
        fVar25 = auVar39._0_4_ * fVar37;
        auVar42 = vroundss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),9);
        auVar46 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
        auVar31 = vmaxss_avx(auVar42,auVar48._0_16_);
        auVar36 = ZEXT816(0) << 0x40;
        auVar30 = vminss_avx(auVar46,auVar39);
        fVar45 = auVar30._0_4_;
        iVar20 = (int)auVar42._0_4_;
        if (iVar20 < 0) {
          iVar20 = -1;
        }
        uVar9 = (int)auVar39._0_4_ + 1U;
        if ((int)auVar46._0_4_ < (int)((int)auVar39._0_4_ + 1U)) {
          uVar9 = (int)auVar46._0_4_;
        }
        lVar23 = (long)(int)auVar31._0_4_;
        pBVar4 = recalculatePrimRef->bounds->items;
        uVar18 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar1 = (float *)((long)&pBVar4[lVar23].lower.field_0 + uVar18);
        fVar49 = *pfVar1;
        fVar50 = pfVar1[1];
        fVar51 = pfVar1[2];
        fVar53 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar23].upper.field_0 + uVar18);
        fVar54 = *pfVar1;
        fVar55 = pfVar1[1];
        fVar58 = pfVar1[2];
        fVar59 = pfVar1[3];
        lVar22 = (long)(int)fVar45;
        pfVar1 = (float *)((long)&pBVar4[lVar22].lower.field_0 + uVar18);
        fVar60 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar22].upper.field_0 + uVar18);
        fVar13 = *pfVar1;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        auVar31 = ZEXT416((uint)(fVar44 - auVar31._0_4_));
        if (uVar9 - iVar20 == 1) {
          auVar31 = vmaxss_avx(auVar31,auVar36);
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar42._0_4_ = fVar60 * auVar30._0_4_ + auVar31._0_4_ * fVar49;
          auVar42._4_4_ = fVar10 * auVar30._4_4_ + auVar31._4_4_ * fVar50;
          auVar42._8_4_ = fVar11 * auVar30._8_4_ + auVar31._8_4_ * fVar51;
          auVar42._12_4_ = fVar12 * auVar30._12_4_ + auVar31._12_4_ * fVar53;
          auVar46._0_4_ = auVar31._0_4_ * fVar54 + fVar13 * auVar30._0_4_;
          auVar46._4_4_ = auVar31._4_4_ * fVar55 + fVar14 * auVar30._4_4_;
          auVar46._8_4_ = auVar31._8_4_ * fVar58 + fVar15 * auVar30._8_4_;
          auVar46._12_4_ = auVar31._12_4_ * fVar59 + fVar16 * auVar30._12_4_;
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - fVar25)),auVar36);
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar36._0_4_ = fVar49 * auVar30._0_4_ + auVar31._0_4_ * fVar60;
          auVar36._4_4_ = fVar50 * auVar30._4_4_ + auVar31._4_4_ * fVar10;
          auVar36._8_4_ = fVar51 * auVar30._8_4_ + auVar31._8_4_ * fVar11;
          auVar36._12_4_ = fVar53 * auVar30._12_4_ + auVar31._12_4_ * fVar12;
          auVar56._0_4_ = fVar54 * auVar30._0_4_ + fVar13 * auVar31._0_4_;
          auVar56._4_4_ = fVar55 * auVar30._4_4_ + fVar14 * auVar31._4_4_;
          auVar56._8_4_ = fVar58 * auVar30._8_4_ + fVar15 * auVar31._8_4_;
          auVar56._12_4_ = fVar59 * auVar30._12_4_ + fVar16 * auVar31._12_4_;
        }
        else {
          lVar17 = lVar22 * 0x20 + uVar18;
          auVar31 = vmaxss_avx(auVar31,auVar36);
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar42._0_4_ =
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18) +
               auVar31._0_4_ * fVar49;
          auVar42._4_4_ =
               auVar30._4_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 4) +
               auVar31._4_4_ * fVar50;
          auVar42._8_4_ =
               auVar30._8_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 8) +
               auVar31._8_4_ * fVar51;
          auVar42._12_4_ =
               auVar30._12_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 0xc) +
               auVar31._12_4_ * fVar53;
          auVar46._0_4_ =
               auVar31._0_4_ * fVar54 +
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18);
          auVar46._4_4_ =
               auVar31._4_4_ * fVar55 +
               auVar30._4_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 4);
          auVar46._8_4_ =
               auVar31._8_4_ * fVar58 +
               auVar30._8_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 8);
          auVar46._12_4_ =
               auVar31._12_4_ * fVar59 +
               auVar30._12_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 0xc);
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - fVar25)),auVar36);
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar36._0_4_ =
               fVar60 * auVar31._0_4_ +
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar22 + -1].lower.field_0 + uVar18);
          auVar36._4_4_ =
               fVar10 * auVar31._4_4_ + auVar30._4_4_ * *(float *)((long)pBVar4 + lVar17 + -0x1c);
          auVar36._8_4_ =
               fVar11 * auVar31._8_4_ + auVar30._8_4_ * *(float *)((long)pBVar4 + lVar17 + -0x18);
          auVar36._12_4_ =
               fVar12 * auVar31._12_4_ + auVar30._12_4_ * *(float *)((long)pBVar4 + lVar17 + -0x14);
          auVar56._0_4_ =
               fVar13 * auVar31._0_4_ + auVar30._0_4_ * *(float *)((long)pBVar4 + lVar17 + -0x10);
          auVar56._4_4_ =
               fVar14 * auVar31._4_4_ + auVar30._4_4_ * *(float *)((long)pBVar4 + lVar17 + -0xc);
          auVar56._8_4_ =
               fVar15 * auVar31._8_4_ + auVar30._8_4_ * *(float *)((long)pBVar4 + lVar17 + -8);
          auVar56._12_4_ =
               fVar16 * auVar31._12_4_ + auVar30._12_4_ * *(float *)((long)pBVar4 + lVar17 + -4);
          uVar21 = iVar20 + 1;
          if ((int)uVar21 < (int)uVar9) {
            pauVar19 = (undefined1 (*) [16])((long)&pBVar4[uVar21].upper.field_0 + uVar18);
            do {
              auVar26._0_4_ = ((float)(int)uVar21 / auVar39._0_4_ - fVar41) / (fVar37 - fVar41);
              auVar26._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar31 = vshufps_avx(auVar26,auVar26,0);
              fVar53 = auVar36._4_4_;
              fVar54 = auVar36._8_4_;
              fVar55 = auVar36._12_4_;
              auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - auVar26._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar26._0_4_)),0);
              fVar44 = auVar42._4_4_;
              fVar25 = auVar42._8_4_;
              fVar45 = auVar42._12_4_;
              auVar34._0_4_ = auVar36._0_4_ * auVar31._0_4_ + auVar42._0_4_ * auVar30._0_4_;
              auVar34._4_4_ = fVar53 * auVar31._4_4_ + fVar44 * auVar30._4_4_;
              auVar34._8_4_ = fVar54 * auVar31._8_4_ + fVar25 * auVar30._8_4_;
              auVar34._12_4_ = fVar55 * auVar31._12_4_ + fVar45 * auVar30._12_4_;
              fVar58 = auVar56._4_4_;
              fVar59 = auVar56._8_4_;
              fVar60 = auVar56._12_4_;
              fVar49 = auVar46._4_4_;
              fVar50 = auVar46._8_4_;
              fVar51 = auVar46._12_4_;
              auVar27._0_4_ = auVar56._0_4_ * auVar31._0_4_ + auVar46._0_4_ * auVar30._0_4_;
              auVar27._4_4_ = fVar58 * auVar31._4_4_ + fVar49 * auVar30._4_4_;
              auVar27._8_4_ = fVar59 * auVar31._8_4_ + fVar50 * auVar30._8_4_;
              auVar27._12_4_ = fVar60 * auVar31._12_4_ + fVar51 * auVar30._12_4_;
              auVar31 = vsubps_avx(pauVar19[-1],auVar34);
              auVar26 = vsubps_avx(*pauVar19,auVar27);
              auVar30 = vminps_avx(auVar31,auVar33);
              auVar31 = vmaxps_avx(auVar26,auVar33);
              auVar42._0_4_ = auVar42._0_4_ + auVar30._0_4_;
              auVar42._4_4_ = fVar44 + auVar30._4_4_;
              auVar42._8_4_ = fVar25 + auVar30._8_4_;
              auVar42._12_4_ = fVar45 + auVar30._12_4_;
              auVar36._0_4_ = auVar36._0_4_ + auVar30._0_4_;
              auVar36._4_4_ = fVar53 + auVar30._4_4_;
              auVar36._8_4_ = fVar54 + auVar30._8_4_;
              auVar36._12_4_ = fVar55 + auVar30._12_4_;
              auVar46._0_4_ = auVar46._0_4_ + auVar31._0_4_;
              auVar46._4_4_ = fVar49 + auVar31._4_4_;
              auVar46._8_4_ = fVar50 + auVar31._8_4_;
              auVar46._12_4_ = fVar51 + auVar31._12_4_;
              auVar56._0_4_ = auVar56._0_4_ + auVar31._0_4_;
              auVar56._4_4_ = fVar58 + auVar31._4_4_;
              auVar56._8_4_ = fVar59 + auVar31._8_4_;
              auVar56._12_4_ = fVar60 + auVar31._12_4_;
              uVar21 = uVar21 + 1;
              pauVar19 = pauVar19 + 2;
            } while (uVar9 != uVar21);
          }
        }
        aVar7.m128 = (__m128)vminps_avx(this->bounds0[0].bounds0.lower.field_0,auVar42);
        aVar5.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds0.upper.field_0,auVar46);
        aVar8.m128 = (__m128)vminps_avx(this->bounds0[0].bounds1.lower.field_0,auVar36);
        aVar6.m128 = (__m128)vmaxps_avx(this->bounds0[0].bounds1.upper.field_0,auVar56);
        this->bounds0[0].bounds0.lower.field_0 = aVar7;
        this->bounds0[0].bounds0.upper.field_0 = aVar5;
        this->bounds0[0].bounds1.lower.field_0 = aVar8;
        this->bounds0[0].bounds1.upper.field_0 = aVar6;
        fVar25 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        BVar3 = prims[begin].time_range;
        auVar31._8_8_ = 0;
        auVar31._0_4_ = BVar3.lower;
        auVar31._4_4_ = BVar3.upper;
        auVar31 = vmovshdup_avx(auVar31);
        fVar37 = BVar3.lower;
        fVar44 = auVar31._0_4_ - fVar37;
        auVar31 = ZEXT416((uint)(((fVar24 - fVar37) / fVar44) * 1.0000002 * fVar25));
        auVar31 = vroundss_avx(auVar31,auVar31,9);
        auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,auVar31);
        auVar30 = ZEXT416((uint)(((fVar2 - fVar37) / fVar44) * 0.99999976 * fVar25));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar25));
        this->count0[0] = this->count0[0] + (long)((int)auVar30._0_4_ - (int)auVar31._0_4_);
        fVar44 = prims[begin].time_range.upper;
        fVar25 = fVar44 * 0.9999;
      }
      if ((fVar2 < fVar25) && (fVar25 = prims[begin].time_range.lower, fVar25 * 1.0001 < fVar38)) {
        auVar40._0_4_ = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        auVar40._4_8_ = SUB128(ZEXT812(0),4);
        auVar40._12_4_ = 0;
        fVar41 = (fVar2 - fVar25) / (fVar44 - fVar25);
        fVar37 = (fVar38 - fVar25) / (fVar44 - fVar25);
        fVar44 = fVar41 * auVar40._0_4_;
        fVar25 = auVar40._0_4_ * fVar37;
        auVar42 = vroundss_avx(ZEXT416((uint)fVar44),ZEXT416((uint)fVar44),9);
        auVar46 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
        auVar31 = vmaxss_avx(auVar42,auVar48._0_16_);
        auVar30 = vminss_avx(auVar46,auVar40);
        fVar45 = auVar30._0_4_;
        iVar20 = (int)auVar42._0_4_;
        if (iVar20 < 0) {
          iVar20 = -1;
        }
        uVar9 = (int)auVar40._0_4_ + 1U;
        if ((int)auVar46._0_4_ < (int)((int)auVar40._0_4_ + 1U)) {
          uVar9 = (int)auVar46._0_4_;
        }
        lVar23 = (long)(int)auVar31._0_4_;
        pBVar4 = recalculatePrimRef->bounds->items;
        uVar18 = (ulong)(uint)prims[begin].lbounds.bounds0.upper.field_0.m128[3] << 0x25 |
                 (ulong)(uint)prims[begin].lbounds.bounds0.lower.field_0.m128[3] << 5;
        pfVar1 = (float *)((long)&pBVar4[lVar23].lower.field_0 + uVar18);
        fVar49 = *pfVar1;
        fVar50 = pfVar1[1];
        fVar51 = pfVar1[2];
        fVar53 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar23].upper.field_0 + uVar18);
        fVar54 = *pfVar1;
        fVar55 = pfVar1[1];
        fVar58 = pfVar1[2];
        fVar59 = pfVar1[3];
        lVar22 = (long)(int)fVar45;
        pfVar1 = (float *)((long)&pBVar4[lVar22].lower.field_0 + uVar18);
        fVar60 = *pfVar1;
        fVar10 = pfVar1[1];
        fVar11 = pfVar1[2];
        fVar12 = pfVar1[3];
        pfVar1 = (float *)((long)&pBVar4[lVar22].upper.field_0 + uVar18);
        fVar13 = *pfVar1;
        fVar14 = pfVar1[1];
        fVar15 = pfVar1[2];
        fVar16 = pfVar1[3];
        auVar31 = ZEXT416((uint)(fVar44 - auVar31._0_4_));
        if (uVar9 - iVar20 == 1) {
          auVar31 = vmaxss_avx(auVar31,ZEXT816(0));
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar43._0_4_ = fVar60 * auVar30._0_4_ + fVar49 * auVar31._0_4_;
          auVar43._4_4_ = fVar10 * auVar30._4_4_ + fVar50 * auVar31._4_4_;
          auVar43._8_4_ = fVar11 * auVar30._8_4_ + fVar51 * auVar31._8_4_;
          auVar43._12_4_ = fVar12 * auVar30._12_4_ + fVar53 * auVar31._12_4_;
          auVar47._0_4_ = fVar13 * auVar30._0_4_ + fVar54 * auVar31._0_4_;
          auVar47._4_4_ = fVar14 * auVar30._4_4_ + fVar55 * auVar31._4_4_;
          auVar47._8_4_ = fVar15 * auVar30._8_4_ + fVar58 * auVar31._8_4_;
          auVar47._12_4_ = fVar16 * auVar30._12_4_ + fVar59 * auVar31._12_4_;
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - fVar25)),ZEXT816(0));
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar52._0_4_ = fVar49 * auVar30._0_4_ + fVar60 * auVar31._0_4_;
          auVar52._4_4_ = fVar50 * auVar30._4_4_ + fVar10 * auVar31._4_4_;
          auVar52._8_4_ = fVar51 * auVar30._8_4_ + fVar11 * auVar31._8_4_;
          auVar52._12_4_ = fVar53 * auVar30._12_4_ + fVar12 * auVar31._12_4_;
          auVar57._0_4_ = fVar54 * auVar30._0_4_ + fVar13 * auVar31._0_4_;
          auVar57._4_4_ = fVar55 * auVar30._4_4_ + fVar14 * auVar31._4_4_;
          auVar57._8_4_ = fVar58 * auVar30._8_4_ + fVar15 * auVar31._8_4_;
          auVar57._12_4_ = fVar59 * auVar30._12_4_ + fVar16 * auVar31._12_4_;
        }
        else {
          lVar17 = lVar22 * 0x20 + uVar18;
          auVar31 = vmaxss_avx(auVar31,ZEXT816(0));
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar43._0_4_ =
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18) +
               fVar49 * auVar31._0_4_;
          auVar43._4_4_ =
               auVar30._4_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 4) +
               fVar50 * auVar31._4_4_;
          auVar43._8_4_ =
               auVar30._8_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 8) +
               fVar51 * auVar31._8_4_;
          auVar43._12_4_ =
               auVar30._12_4_ * *(float *)((long)&pBVar4[lVar23 + 1].lower.field_0 + uVar18 + 0xc) +
               fVar53 * auVar31._12_4_;
          auVar47._0_4_ =
               fVar54 * auVar31._0_4_ +
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18);
          auVar47._4_4_ =
               fVar55 * auVar31._4_4_ +
               auVar30._4_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 4);
          auVar47._8_4_ =
               fVar58 * auVar31._8_4_ +
               auVar30._8_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 8);
          auVar47._12_4_ =
               fVar59 * auVar31._12_4_ +
               auVar30._12_4_ * *(float *)((long)&pBVar4[lVar23 + 1].upper.field_0 + uVar18 + 0xc);
          auVar31 = vmaxss_avx(ZEXT416((uint)(fVar45 - fVar25)),ZEXT816(0));
          auVar30 = vshufps_avx(auVar31,auVar31,0);
          auVar31 = ZEXT416((uint)(1.0 - auVar31._0_4_));
          auVar31 = vshufps_avx(auVar31,auVar31,0);
          auVar52._0_4_ =
               fVar60 * auVar31._0_4_ +
               auVar30._0_4_ * *(float *)((long)&pBVar4[lVar22 + -1].lower.field_0 + uVar18);
          auVar52._4_4_ =
               fVar10 * auVar31._4_4_ + auVar30._4_4_ * *(float *)((long)pBVar4 + lVar17 + -0x1c);
          auVar52._8_4_ =
               fVar11 * auVar31._8_4_ + auVar30._8_4_ * *(float *)((long)pBVar4 + lVar17 + -0x18);
          auVar52._12_4_ =
               fVar12 * auVar31._12_4_ + auVar30._12_4_ * *(float *)((long)pBVar4 + lVar17 + -0x14);
          auVar57._0_4_ =
               fVar13 * auVar31._0_4_ + auVar30._0_4_ * *(float *)((long)pBVar4 + lVar17 + -0x10);
          auVar57._4_4_ =
               fVar14 * auVar31._4_4_ + auVar30._4_4_ * *(float *)((long)pBVar4 + lVar17 + -0xc);
          auVar57._8_4_ =
               fVar15 * auVar31._8_4_ + auVar30._8_4_ * *(float *)((long)pBVar4 + lVar17 + -8);
          auVar57._12_4_ =
               fVar16 * auVar31._12_4_ + auVar30._12_4_ * *(float *)((long)pBVar4 + lVar17 + -4);
          uVar21 = iVar20 + 1;
          if ((int)uVar21 < (int)uVar9) {
            pauVar19 = (undefined1 (*) [16])((long)&pBVar4[uVar21].upper.field_0 + uVar18);
            do {
              auVar28._0_4_ = ((float)(int)uVar21 / auVar40._0_4_ - fVar41) / (fVar37 - fVar41);
              auVar28._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar31 = vshufps_avx(auVar28,auVar28,0);
              fVar53 = auVar52._4_4_;
              fVar54 = auVar52._8_4_;
              fVar55 = auVar52._12_4_;
              auVar30 = vshufps_avx(ZEXT416((uint)(1.0 - auVar28._0_4_)),
                                    ZEXT416((uint)(1.0 - auVar28._0_4_)),0);
              fVar44 = auVar43._4_4_;
              fVar25 = auVar43._8_4_;
              fVar45 = auVar43._12_4_;
              auVar35._0_4_ = auVar52._0_4_ * auVar31._0_4_ + auVar43._0_4_ * auVar30._0_4_;
              auVar35._4_4_ = fVar53 * auVar31._4_4_ + fVar44 * auVar30._4_4_;
              auVar35._8_4_ = fVar54 * auVar31._8_4_ + fVar25 * auVar30._8_4_;
              auVar35._12_4_ = fVar55 * auVar31._12_4_ + fVar45 * auVar30._12_4_;
              fVar58 = auVar57._4_4_;
              fVar59 = auVar57._8_4_;
              fVar60 = auVar57._12_4_;
              fVar49 = auVar47._4_4_;
              fVar50 = auVar47._8_4_;
              fVar51 = auVar47._12_4_;
              auVar29._0_4_ = auVar57._0_4_ * auVar31._0_4_ + auVar47._0_4_ * auVar30._0_4_;
              auVar29._4_4_ = fVar58 * auVar31._4_4_ + fVar49 * auVar30._4_4_;
              auVar29._8_4_ = fVar59 * auVar31._8_4_ + fVar50 * auVar30._8_4_;
              auVar29._12_4_ = fVar60 * auVar31._12_4_ + fVar51 * auVar30._12_4_;
              auVar31 = vsubps_avx(pauVar19[-1],auVar35);
              auVar42 = vsubps_avx(*pauVar19,auVar29);
              auVar30 = vminps_avx(auVar31,auVar33);
              auVar31 = vmaxps_avx(auVar42,auVar33);
              auVar43._0_4_ = auVar43._0_4_ + auVar30._0_4_;
              auVar43._4_4_ = fVar44 + auVar30._4_4_;
              auVar43._8_4_ = fVar25 + auVar30._8_4_;
              auVar43._12_4_ = fVar45 + auVar30._12_4_;
              auVar52._0_4_ = auVar52._0_4_ + auVar30._0_4_;
              auVar52._4_4_ = fVar53 + auVar30._4_4_;
              auVar52._8_4_ = fVar54 + auVar30._8_4_;
              auVar52._12_4_ = fVar55 + auVar30._12_4_;
              auVar47._0_4_ = auVar47._0_4_ + auVar31._0_4_;
              auVar47._4_4_ = fVar49 + auVar31._4_4_;
              auVar47._8_4_ = fVar50 + auVar31._8_4_;
              auVar47._12_4_ = fVar51 + auVar31._12_4_;
              auVar57._0_4_ = auVar57._0_4_ + auVar31._0_4_;
              auVar57._4_4_ = fVar58 + auVar31._4_4_;
              auVar57._8_4_ = fVar59 + auVar31._8_4_;
              auVar57._12_4_ = fVar60 + auVar31._12_4_;
              uVar21 = uVar21 + 1;
              pauVar19 = pauVar19 + 2;
            } while (uVar9 != uVar21);
          }
        }
        aVar7.m128 = (__m128)vminps_avx(this->bounds1[0].bounds0.lower.field_0,auVar43);
        aVar5.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds0.upper.field_0,auVar47);
        aVar8.m128 = (__m128)vminps_avx(this->bounds1[0].bounds1.lower.field_0,auVar52);
        aVar6.m128 = (__m128)vmaxps_avx(this->bounds1[0].bounds1.upper.field_0,auVar57);
        this->bounds1[0].bounds0.lower.field_0 = aVar7;
        this->bounds1[0].bounds0.upper.field_0 = aVar5;
        this->bounds1[0].bounds1.lower.field_0 = aVar8;
        this->bounds1[0].bounds1.upper.field_0 = aVar6;
        fVar25 = (float)(uint)prims[begin].lbounds.bounds1.upper.field_0.m128[3];
        BVar3 = prims[begin].time_range;
        auVar32._8_8_ = 0;
        auVar32._0_4_ = BVar3.lower;
        auVar32._4_4_ = BVar3.upper;
        fVar37 = BVar3.lower;
        auVar31 = vmovshdup_avx(auVar32);
        fVar44 = auVar31._0_4_ - fVar37;
        auVar31 = ZEXT416((uint)(((fVar2 - fVar37) / fVar44) * 1.0000002 * fVar25));
        auVar31 = vroundss_avx(auVar31,auVar31,9);
        auVar48 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,auVar31);
        auVar30 = ZEXT416((uint)(((fVar38 - fVar37) / fVar44) * 0.99999976 * fVar25));
        auVar30 = vroundss_avx(auVar30,auVar30,10);
        auVar30 = vminss_avx(auVar30,ZEXT416((uint)fVar25));
        this->count1[0] = this->count1[0] + (long)((int)auVar30._0_4_ - (int)auVar31._0_4_);
      }
      begin = begin + 1;
    } while (begin != end);
  }
  return;
}

Assistant:

void bin(const PrimRefMB* prims, size_t begin, size_t end, BBox1f time_range, const SetMB& set, const RecalculatePrimRef& recalculatePrimRef)
          {
            for (int b=0; b<BINS-1; b++)
            {
              const float t = float(b+1)/float(BINS);
              const float ct = lerp(time_range.lower,time_range.upper,t);
              const float center_time = set.align_time(ct);
              if (center_time <= time_range.lower) continue;
              if (center_time >= time_range.upper) continue;
              const BBox1f dt0(time_range.lower,center_time);
              const BBox1f dt1(center_time,time_range.upper);
              
              /* find linear bounds for both time segments */
              for (size_t i=begin; i<end; i++) 
              {
                if (prims[i].time_range_overlap(dt0))
                {
                  const LBBox3fa bn0 = recalculatePrimRef.linearBounds(prims[i],dt0);
#if MBLUR_BIN_LBBOX
                  bounds0[b].extend(bn0);
#else
                  bounds0[b].extend(bn0.interpolate(0.5f));
#endif
                  count0[b] += prims[i].timeSegmentRange(dt0).size();
                }

                if (prims[i].time_range_overlap(dt1))
                {
                  const LBBox3fa bn1 = recalculatePrimRef.linearBounds(prims[i],dt1);
#if MBLUR_BIN_LBBOX
                  bounds1[b].extend(bn1);
#else
                  bounds1[b].extend(bn1.interpolate(0.5f));
#endif
                  count1[b] += prims[i].timeSegmentRange(dt1).size();
                }
              }
            }
          }